

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

upb_test_TestMessageSet *
upb_test_TestMessageSet_parse_ex
          (char *buf,size_t size,upb_ExtensionRegistry *extreg,int options,upb_Arena *arena)

{
  upb_DecodeStatus uVar1;
  upb_test_TestMessageSet *msg;
  upb_test_TestMessageSet *puVar2;
  
  msg = upb_test_TestMessageSet_new(arena);
  if (msg == (upb_test_TestMessageSet *)0x0) {
    puVar2 = (upb_test_TestMessageSet *)0x0;
  }
  else {
    uVar1 = upb_Decode(buf,size,&msg->base_dont_copy_me__upb_internal_use_only,
                       &upb_0test__TestMessageSet_msg_init,extreg,options,arena);
    puVar2 = (upb_test_TestMessageSet *)0x0;
    if (uVar1 == kUpb_DecodeStatus_Ok) {
      puVar2 = msg;
    }
  }
  return puVar2;
}

Assistant:

UPB_INLINE upb_test_TestMessageSet* upb_test_TestMessageSet_parse_ex(const char* buf, size_t size,
                           const upb_ExtensionRegistry* extreg,
                           int options, upb_Arena* arena) {
  upb_test_TestMessageSet* ret = upb_test_TestMessageSet_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &upb_0test__TestMessageSet_msg_init, extreg, options,
                 arena) != kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}